

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing.cpp
# Opt level: O1

tracer_unique_ptr_t so_5::msg_tracing::std_cerr_tracer(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>,_true,_true>
  in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x38);
  *puVar1 = &PTR__tracer_t_00289f80;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = &std::cerr;
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>_>
   ._M_t.
   super__Tuple_impl<0UL,_so_5::msg_tracing::tracer_t_*,_std::default_delete<so_5::msg_tracing::tracer_t>_>
   .super__Head_base<0UL,_so_5::msg_tracing::tracer_t_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>,_true,_true>
          )(tuple<so_5::msg_tracing::tracer_t_*,_std::default_delete<so_5::msg_tracing::tracer_t>_>)
           in_RDI.
           super___uniq_ptr_impl<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::msg_tracing::tracer_t_*,_std::default_delete<so_5::msg_tracing::tracer_t>_>
           .super__Head_base<0UL,_so_5::msg_tracing::tracer_t_*,_false>._M_head_impl;
}

Assistant:

SO_5_FUNC tracer_unique_ptr_t
std_cerr_tracer()
	{
		return tracer_unique_ptr_t{ new impl::std_stream_tracer_t{ std::cerr } };
	}